

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O1

Vertex * Assimp::Vertex::BinaryOp<std::plus>(Vertex *__return_storage_ptr__,Vertex *v0,Vertex *v1)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  long lVar8;
  
  lVar8 = 0;
  memset(__return_storage_ptr__,0,0x110);
  fVar2 = (v0->position).y;
  fVar3 = (v1->position).y;
  fVar4 = (v0->position).z;
  fVar5 = (v1->position).z;
  (__return_storage_ptr__->position).x = (v0->position).x + (v1->position).x;
  (__return_storage_ptr__->position).y = fVar2 + fVar3;
  (__return_storage_ptr__->position).z = fVar4 + fVar5;
  fVar2 = (v0->normal).y;
  fVar3 = (v1->normal).y;
  fVar4 = (v0->normal).z;
  fVar5 = (v1->normal).z;
  (__return_storage_ptr__->normal).x = (v0->normal).x + (v1->normal).x;
  (__return_storage_ptr__->normal).y = fVar2 + fVar3;
  (__return_storage_ptr__->normal).z = fVar4 + fVar5;
  fVar2 = (v0->tangent).y;
  fVar3 = (v1->tangent).y;
  fVar4 = (v0->tangent).z;
  fVar5 = (v1->tangent).z;
  (__return_storage_ptr__->tangent).x = (v0->tangent).x + (v1->tangent).x;
  (__return_storage_ptr__->tangent).y = fVar2 + fVar3;
  (__return_storage_ptr__->tangent).z = fVar4 + fVar5;
  fVar2 = (v0->bitangent).y;
  fVar3 = (v1->bitangent).y;
  fVar4 = (v0->bitangent).z;
  fVar5 = (v1->bitangent).z;
  (__return_storage_ptr__->bitangent).x = (v0->bitangent).x + (v1->bitangent).x;
  (__return_storage_ptr__->bitangent).y = fVar2 + fVar3;
  (__return_storage_ptr__->bitangent).z = fVar4 + fVar5;
  do {
    fVar2 = *(float *)((long)&v0->texcoords[0].z + lVar8);
    fVar3 = *(float *)((long)&v1->texcoords[0].z + lVar8);
    *(ulong *)((long)&__return_storage_ptr__->texcoords[0].x + lVar8) =
         CONCAT44(*(float *)((long)&v0->texcoords[0].y + lVar8) +
                  *(float *)((long)&v1->texcoords[0].y + lVar8),
                  *(float *)((long)&v0->texcoords[0].x + lVar8) +
                  *(float *)((long)&v1->texcoords[0].x + lVar8));
    *(float *)((long)&__return_storage_ptr__->texcoords[0].z + lVar8) = fVar2 + fVar3;
    lVar8 = lVar8 + 0xc;
  } while (lVar8 != 0x60);
  lVar8 = 0;
  do {
    fVar2 = *(float *)((long)&v0->colors[0].g + lVar8);
    fVar3 = *(float *)((long)&v1->colors[0].g + lVar8);
    fVar4 = *(float *)((long)&v0->colors[0].b + lVar8);
    fVar5 = *(float *)((long)&v1->colors[0].b + lVar8);
    fVar6 = *(float *)((long)&v0->colors[0].a + lVar8);
    fVar7 = *(float *)((long)&v1->colors[0].a + lVar8);
    pfVar1 = (float *)((long)&__return_storage_ptr__->colors[0].r + lVar8);
    *pfVar1 = *(float *)((long)&v0->colors[0].r + lVar8) +
              *(float *)((long)&v1->colors[0].r + lVar8);
    pfVar1[1] = fVar2 + fVar3;
    pfVar1[2] = fVar4 + fVar5;
    pfVar1[3] = fVar6 + fVar7;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, const Vertex& v1) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D>()(v0.position,v1.position);
        res.normal    = op<aiVector3D>()(v0.normal,v1.normal);
        res.tangent   = op<aiVector3D>()(v0.tangent,v1.tangent);
        res.bitangent = op<aiVector3D>()(v0.bitangent,v1.bitangent);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D>()(v0.texcoords[i],v1.texcoords[i]);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D>()(v0.colors[i],v1.colors[i]);
        }
        return res;
    }